

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

void __thiscall AActor::LinkToWorld(AActor *this,bool spawningmapthing,sector_t *sector)

{
  double dVar1;
  AActor *pAVar2;
  FBlockNode *pFVar3;
  int iVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  subsector_t *psVar8;
  FBlockNode *pFVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  undefined7 in_register_00000031;
  long lVar14;
  WORD *pWVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  FBlockNode **ppFVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  int iVar24;
  FBlockNode **ppFVar25;
  double dVar26;
  double dVar27;
  FPortalGroupArray check;
  FPortalGroupArray local_c8;
  ulong local_a0;
  ulong local_98;
  double local_90;
  double local_88;
  long local_80;
  ulong local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  ulong local_50;
  DVector3 local_48;
  
  if ((((int)CONCAT71(in_register_00000031,spawningmapthing) == 0) || (sector != (sector_t *)0x0))
     || (((this->flags4).Value & 0x40) == 0)) {
    cVar6 = spawningmapthing;
    if (sector != (sector_t *)0x0) goto LAB_00546c96;
  }
  else {
    bVar5 = FixMapthingPos(this);
    cVar6 = !bVar5;
  }
  dVar26 = (this->__Pos).X;
  dVar27 = (this->__Pos).Y;
  if ((cVar6 == '\0') || (numgamenodes == 0)) {
    psVar8 = P_PointInSubsector(dVar26,dVar27);
    sector = psVar8->sector;
  }
  else {
    sector = P_PointInSectorBuggy(dVar26,dVar27);
  }
LAB_00546c96:
  this->Sector = sector;
  psVar8 = R_PointInSubsector(SUB84((this->__Pos).X + 103079215104.0,0),
                              SUB84((this->__Pos).Y + 103079215104.0,0));
  this->subsector = psVar8;
  uVar7 = (this->flags).Value;
  if ((uVar7 & 8) == 0) {
    pAVar2 = sector->thinglist;
    this->snext = pAVar2;
    if (pAVar2 != (AActor *)0x0) {
      pAVar2->sprev = &this->snext;
    }
    this->sprev = &sector->thinglist;
    sector->thinglist = this;
    P_CreateSecNodeList(this);
    this->touching_sectorlist = sector_list;
    sector_list = (msecnode_t *)0x0;
    uVar7 = (this->flags).Value;
  }
  if ((uVar7 & 0x10) == 0) {
    local_c8.data.Array = (unsigned_short *)0x0;
    local_c8.data.Most = 0;
    local_c8.data.Count = 0;
    local_c8.method = 1;
    local_c8.varused = 0;
    local_c8.inited = false;
    local_48.X = (this->__Pos).X;
    local_48.Y = (this->__Pos).Y;
    local_48.Z = (this->__Pos).Z;
    P_CollectConnectedGroups
              (this->Sector->PortalGroup,&local_48,local_48.Z + this->Height,this->radius,&local_c8)
    ;
    this->BlockNode = (FBlockNode *)0x0;
    iVar4 = bmapwidth;
    uVar7 = (uint)local_c8.varused;
    if (-1 < (int)(local_c8.data.Count + local_c8.varused)) {
      ppFVar19 = &this->BlockNode;
      local_88 = bmaporgx;
      local_90 = bmaporgy;
      lVar14 = (long)bmapwidth;
      uVar16 = (ulong)(uint)bmapheight;
      uVar11 = bmapwidth - 1;
      iVar17 = bmapheight + -1;
      local_80 = lVar14 * 8;
      uVar18 = 0xffffffff;
      local_a0 = uVar16;
      uVar10 = local_c8.data.Count;
      do {
        uVar13 = (uint)uVar18;
        if (uVar13 == 0xffffffff) {
          dVar26 = (this->__Pos).X;
          dVar27 = (this->__Pos).Y;
        }
        else {
          pWVar15 = local_c8.entry + uVar18;
          if (3 < uVar13) {
            pWVar15 = local_c8.data.Array + (uVar13 - 4);
          }
          uVar13 = this->Sector->PortalGroup;
          dVar26 = 0.0;
          dVar27 = 0.0;
          if (uVar13 != (*pWVar15 & 0x3fff)) {
            dVar26 = Displacements.data.Array
                     [(int)((*pWVar15 & 0x3fff) * Displacements.size + uVar13)].pos.X;
            dVar27 = Displacements.data.Array
                     [(int)((*pWVar15 & 0x3fff) * Displacements.size + uVar13)].pos.Y;
          }
          dVar26 = (this->__Pos).X + dVar26;
          dVar27 = (this->__Pos).Y + dVar27;
        }
        dVar1 = this->radius;
        uVar13 = (uint)(((dVar26 - dVar1) - local_88) * 0.0078125);
        if (((int)uVar13 < iVar4) &&
           (uVar23 = (uint)(((dVar26 + dVar1) - local_88) * 0.0078125), -1 < (int)uVar23)) {
          iVar24 = (int)(((dVar27 + dVar1) - local_90) * 0.0078125);
          if (-1 < iVar24) {
            uVar20 = (uint)(((dVar27 - dVar1) - local_90) * 0.0078125);
            if ((int)uVar20 < (int)uVar16) {
              if ((int)uVar20 < 1) {
                uVar20 = 0;
              }
              if (iVar17 < iVar24) {
                iVar24 = iVar17;
              }
              if ((int)uVar20 <= iVar24) {
                local_98 = uVar18;
                if ((int)uVar11 < (int)uVar23) {
                  uVar23 = uVar11;
                }
                local_60 = (ulong)uVar13;
                if ((int)uVar13 < 1) {
                  local_60 = 0;
                }
                local_68 = (ulong)uVar23;
                uVar16 = (ulong)uVar20;
                iVar21 = uVar20 * iVar4 + (int)local_60;
                lVar22 = (lVar14 * uVar16 + local_60) * 8;
                local_70 = (uVar23 + 1) - local_60;
                local_78 = (ulong)(iVar24 + 1);
                do {
                  local_50 = uVar16;
                  local_58 = lVar22;
                  lVar12 = local_70;
                  iVar24 = iVar21;
                  if ((int)local_60 <= (int)local_68) {
                    do {
                      ppFVar25 = (FBlockNode **)((long)blocklinks + lVar22);
                      if (FBlockNode::FreeBlocks == (FBlockNode *)0x0) {
                        pFVar9 = (FBlockNode *)operator_new(0x30);
                      }
                      else {
                        pFVar9 = FBlockNode::FreeBlocks;
                        FBlockNode::FreeBlocks = FBlockNode::FreeBlocks->NextBlock;
                      }
                      pFVar9->BlockIndex = iVar24;
                      pFVar9->Me = this;
                      pFVar9->PrevActor = (FBlockNode **)0x0;
                      pFVar9->NextActor = (FBlockNode *)0x0;
                      pFVar9->PrevBlock = (FBlockNode **)0x0;
                      pFVar9->NextBlock = (FBlockNode *)0x0;
                      pFVar3 = *ppFVar25;
                      pFVar9->NextActor = pFVar3;
                      if (pFVar3 != (FBlockNode *)0x0) {
                        pFVar3->PrevActor = &pFVar9->NextActor;
                      }
                      pFVar9->PrevActor = ppFVar25;
                      *ppFVar25 = pFVar9;
                      pFVar9->PrevBlock = ppFVar19;
                      pFVar9->NextBlock = (FBlockNode *)0x0;
                      *ppFVar19 = pFVar9;
                      ppFVar19 = &pFVar9->NextBlock;
                      iVar24 = iVar24 + 1;
                      lVar22 = lVar22 + 8;
                      lVar12 = lVar12 + -1;
                    } while (lVar12 != 0);
                  }
                  uVar16 = local_50 + 1;
                  iVar21 = iVar21 + iVar4;
                  lVar22 = local_58 + local_80;
                } while (uVar16 != local_78);
                uVar7 = (uint)local_c8.varused;
                uVar16 = local_a0;
                uVar18 = local_98;
                uVar10 = local_c8.data.Count;
              }
            }
          }
        }
        uVar13 = (int)uVar18 + 1;
        uVar18 = (ulong)uVar13;
      } while ((int)uVar13 < (int)(uVar7 + uVar10));
    }
    TArray<unsigned_short,_unsigned_short>::~TArray(&local_c8.data);
  }
  if (!spawningmapthing) {
    UpdateRenderSectorList(this);
  }
  return;
}

Assistant:

void AActor::LinkToWorld(bool spawningmapthing, sector_t *sector)
{
	bool spawning = spawningmapthing;

	if (spawning)
	{
		if ((flags4 & MF4_FIXMAPTHINGPOS) && sector == NULL)
		{
			if (FixMapthingPos()) spawning = false;
		}
	}

	if (sector == NULL)
	{
		if (!spawning || numgamenodes == 0)
		{
			sector = P_PointInSector(Pos());
		}
		else
		{
			sector = P_PointInSectorBuggy(X(), Y());
		}
	}

	Sector = sector;
	subsector = R_PointInSubsector(Pos());	// this is from the rendering nodes, not the gameplay nodes!

	if (!(flags & MF_NOSECTOR))
	{
		// invisible things don't go into the sector links
		// killough 8/11/98: simpler scheme using pointer-to-pointer prev
		// pointers, allows head nodes to be treated like everything else

		AActor **link = &sector->thinglist;
		AActor *next = *link;
		if ((snext = next))
			next->sprev = &snext;
		sprev = link;
		*link = this;

		// phares 3/16/98
		//
		// If sector_list isn't NULL, it has a collection of sector
		// nodes that were just removed from this Thing.

		// Collect the sectors the object will live in by looking at
		// the existing sector_list and adding new nodes and deleting
		// obsolete ones.

		// When a node is deleted, its sector links (the links starting
		// at sector_t->touching_thinglist) are broken. When a node is
		// added, new sector links are created.
		P_CreateSecNodeList(this);
		touching_sectorlist = sector_list;	// Attach to thing
		sector_list = NULL;		// clear for next time
	}


	// link into blockmap (inert things don't need to be in the blockmap)
	if (!(flags & MF_NOBLOCKMAP))
	{
		FPortalGroupArray check;

		P_CollectConnectedGroups(Sector->PortalGroup, Pos(), Top(), radius, check);

		BlockNode = NULL;
		FBlockNode **alink = &this->BlockNode;
		for (int i = -1; i < (int)check.Size(); i++)
		{
			DVector3 pos = i==-1? Pos() : PosRelative(check[i] & ~FPortalGroupArray::FLAT);

			int x1 = GetBlockX(pos.X - radius);
			int x2 = GetBlockX(pos.X + radius);
			int y1 = GetBlockY(pos.Y - radius);
			int y2 = GetBlockY(pos.Y + radius);

			if (x1 >= bmapwidth || x2 < 0 || y1 >= bmapheight || y2 < 0)
			{ // thing is off the map
			}
			else
			{ // [RH] Link into every block this actor touches, not just the center one
				x1 = MAX(0, x1);
				y1 = MAX(0, y1);
				x2 = MIN(bmapwidth - 1, x2);
				y2 = MIN(bmapheight - 1, y2);
				for (int y = y1; y <= y2; ++y)
				{
					for (int x = x1; x <= x2; ++x)
					{
						FBlockNode **link = &blocklinks[y*bmapwidth + x];
						FBlockNode *node = FBlockNode::Create(this, x, y, this->Sector->PortalGroup);

						// Link in to block
						if ((node->NextActor = *link) != NULL)
						{
							(*link)->PrevActor = &node->NextActor;
						}
						node->PrevActor = link;
						*link = node;

						// Link in to actor
						node->PrevBlock = alink;
						node->NextBlock = NULL;
						(*alink) = node;
						alink = &node->NextBlock;
					}
				}
			}
		}
	}
	// Portal links cannot be done unless the level is fully initialized.
	if (!spawningmapthing) UpdateRenderSectorList();
}